

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# literal.cpp
# Opt level: O1

Literal * __thiscall
wasm::Literal::addI16x8(Literal *__return_storage_ptr__,Literal *this,Literal *other)

{
  Type *__return_storage_ptr___00;
  Literal *val;
  long lVar1;
  Literal *this_00;
  undefined1 local_1c0 [8];
  LaneArray<8> other_lanes;
  LaneArray<8> lanes;
  
  getLanes<unsigned_short,8>((LaneArray<8> *)&other_lanes._M_elems[7].type,(wasm *)this,other);
  getLanes<unsigned_short,8>((LaneArray<8> *)local_1c0,(wasm *)other,val);
  lVar1 = 0;
  __return_storage_ptr___00 = &lanes._M_elems[7].type;
  do {
    this_00 = (Literal *)((long)lanes._M_elems + lVar1 + -8);
    add((Literal *)__return_storage_ptr___00,this_00,(Literal *)(local_1c0 + lVar1));
    if (this_00 != (Literal *)__return_storage_ptr___00) {
      ~Literal(this_00);
      Literal(this_00,(Literal *)__return_storage_ptr___00);
    }
    ~Literal((Literal *)__return_storage_ptr___00);
    lVar1 = lVar1 + 0x18;
  } while (lVar1 != 0xc0);
  Literal(__return_storage_ptr__,(LaneArray<8> *)&other_lanes._M_elems[7].type);
  lVar1 = 0xa8;
  do {
    ~Literal((Literal *)(local_1c0 + lVar1));
    lVar1 = lVar1 + -0x18;
  } while (lVar1 != -0x18);
  lVar1 = 0xa8;
  do {
    ~Literal((Literal *)((long)lanes._M_elems + lVar1 + -8));
    lVar1 = lVar1 + -0x18;
  } while (lVar1 != -0x18);
  return __return_storage_ptr__;
}

Assistant:

Literal Literal::addI16x8(const Literal& other) const {
  return binary<8, &Literal::getLanesUI16x8, &Literal::add>(*this, other);
}